

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O2

int ps_alignment_populate(ps_alignment_t *al)

{
  ps_alignment_vector_t *vec;
  ushort uVar1;
  short sVar2;
  short sVar3;
  uint16 uVar4;
  int wid;
  int iVar5;
  dict2pid_t *d2p;
  bin_mdef_t *pbVar6;
  dict_t *pdVar7;
  int32 iVar8;
  s3ssid_t sVar9;
  ps_alignment_entry_t *ppVar10;
  char *fmt;
  s3ssid_t **ppsVar11;
  int iVar12;
  long lVar13;
  int32 iVar14;
  int32 iVar15;
  int iVar16;
  ulong uVar17;
  ps_alignment_entry_t *ppVar18;
  
  (al->sseq).n_ent = 0;
  vec = &al->sseq;
  (al->state).n_ent = 0;
  d2p = al->d2p;
  pbVar6 = d2p->mdef;
  pdVar7 = d2p->dict;
  iVar15 = pbVar6->sil;
  uVar17 = 0;
  while( true ) {
    uVar1 = (al->word).n_ent;
    if (uVar1 <= uVar17) {
      uVar17 = 0;
      do {
        if ((al->sseq).n_ent <= uVar17) {
          return 0;
        }
        ppVar18 = vec->seq + uVar17;
        for (lVar13 = 0; lVar13 < pbVar6->n_emit_state; lVar13 = lVar13 + 1) {
          ppVar10 = ps_alignment_vector_grow_one(&al->state);
          if (ppVar10 == (ps_alignment_entry_t *)0x0) {
            fmt = "Failed to add state entry!\n";
            lVar13 = 0xe6;
            goto LAB_0010b6cb;
          }
          uVar4 = pbVar6->sseq[(ppVar18->id).pid.ssid][lVar13];
          (ppVar10->id).pid.cipid = uVar4;
          if (uVar4 == 0xffff) {
            __assert_fail("sent->id.senid != BAD_SENID",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                          ,0xea,"int ps_alignment_populate(ps_alignment_t *)");
          }
          iVar15 = ppVar18->duration;
          ppVar10->start = ppVar18->start;
          ppVar10->duration = iVar15;
          ppVar10->score = 0;
          ppVar10->parent = (int)uVar17;
          if (lVar13 == 0) {
            ppVar18->child = (uint)(((long)ppVar10 - (long)(al->state).seq) / 0x1c) & 0xffff;
          }
        }
        uVar17 = uVar17 + 1;
      } while( true );
    }
    ppVar10 = (al->word).seq;
    ppVar18 = ppVar10 + uVar17;
    if (uVar17 < uVar1 - 1) {
      iVar14 = (int32)*pdVar7->word[ppVar18[1].id.wid].ciphone;
    }
    else {
      iVar14 = pbVar6->sil;
    }
    wid = ppVar10[uVar17].id.wid;
    iVar5 = pdVar7->word[wid].pronlen;
    ppVar10 = ps_alignment_vector_grow_one(vec);
    if (ppVar10 == (ps_alignment_entry_t *)0x0) break;
    sVar2 = *pdVar7->word[wid].ciphone;
    (ppVar10->id).pid.cipid = sVar2;
    (ppVar10->id).pid.tmatid = pbVar6->phone[sVar2].tmat;
    iVar8 = ppVar18->duration;
    ppVar10->start = ppVar18->start;
    ppVar10->duration = iVar8;
    ppVar10->score = 0;
    iVar16 = (int)uVar17;
    ppVar10->parent = iVar16;
    ppVar18->child = (uint)(((long)ppVar10 - (long)vec->seq) / 0x1c) & 0xffff;
    sVar2 = (ppVar10->id).pid.cipid;
    if (iVar5 == 1) {
      ppsVar11 = d2p->lrdiph_rc[sVar2] + iVar15;
      iVar15 = iVar14;
    }
    else {
      ppsVar11 = d2p->ldiph_lc[sVar2] + pdVar7->word[wid].ciphone[1];
    }
    sVar9 = (*ppsVar11)[iVar15];
    (ppVar10->id).pid.ssid = sVar9;
    if (sVar9 == 0xffff) {
      __assert_fail("sent->id.pid.ssid != BAD_SSID",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                    ,0xb2,"int ps_alignment_populate(ps_alignment_t *)");
    }
    iVar12 = iVar5 + -2;
    for (lVar13 = 1; lVar13 < (long)iVar5 + -1; lVar13 = lVar13 + 1) {
      ppVar10 = ps_alignment_vector_grow_one(vec);
      if (ppVar10 == (ps_alignment_entry_t *)0x0) {
        fmt = "Failed to add phone entry!\n";
        lVar13 = 0xb7;
        goto LAB_0010b6cb;
      }
      sVar2 = pdVar7->word[wid].ciphone[lVar13];
      (ppVar10->id).pid.cipid = sVar2;
      (ppVar10->id).pid.tmatid = pbVar6->phone[sVar2].tmat;
      sVar9 = dict2pid_internal(d2p,wid,(int)lVar13);
      (ppVar10->id).pid.ssid = sVar9;
      if (sVar9 == 0xffff) {
        __assert_fail("sent->id.pid.ssid != BAD_SSID",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                      ,0xbd,"int ps_alignment_populate(ps_alignment_t *)");
      }
      iVar15 = ppVar18->duration;
      ppVar10->start = ppVar18->start;
      ppVar10->duration = iVar15;
      ppVar10->score = 0;
      ppVar10->parent = iVar16;
      iVar12 = iVar12 + -1;
    }
    if ((int)lVar13 < iVar5) {
      if (iVar12 != 0) {
        __assert_fail("j == len - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                      ,199,"int ps_alignment_populate(ps_alignment_t *)");
      }
      ppVar10 = ps_alignment_vector_grow_one(vec);
      if (ppVar10 == (ps_alignment_entry_t *)0x0) {
        fmt = "Failed to add phone entry!\n";
        lVar13 = 0xc9;
        goto LAB_0010b6cb;
      }
      sVar2 = pdVar7->word[wid].ciphone[(long)pdVar7->word[wid].pronlen + -1];
      (ppVar10->id).pid.cipid = sVar2;
      (ppVar10->id).pid.tmatid = pbVar6->phone[sVar2].tmat;
      sVar3 = pdVar7->word[wid].ciphone[(long)pdVar7->word[wid].pronlen + -2];
      sVar9 = d2p->rssid[sVar2][sVar3].ssid[d2p->rssid[sVar2][sVar3].cimap[iVar14]];
      (ppVar10->id).pid.ssid = sVar9;
      if (sVar9 == 0xffff) {
        __assert_fail("sent->id.pid.ssid != BAD_SSID",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                      ,0xd1,"int ps_alignment_populate(ps_alignment_t *)");
      }
      iVar15 = ppVar18->duration;
      ppVar10->start = ppVar18->start;
      ppVar10->duration = iVar15;
      ppVar10->score = 0;
      ppVar10->parent = iVar16;
    }
    iVar15 = (int32)pdVar7->word[wid].ciphone[(long)pdVar7->word[wid].pronlen + -1];
    uVar17 = uVar17 + 1;
  }
  fmt = "Failed to add phone entry!\n";
  lVar13 = 0xa1;
LAB_0010b6cb:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
          ,lVar13,fmt);
  return -1;
}

Assistant:

int
ps_alignment_populate(ps_alignment_t *al)
{
    dict2pid_t *d2p;
    dict_t *dict;
    bin_mdef_t *mdef;
    int i, lc;

    /* Clear phone and state sequences. */
    ps_alignment_vector_empty(&al->sseq);
    ps_alignment_vector_empty(&al->state);

    /* For each word, expand to phones/senone sequences. */
    d2p = al->d2p;
    dict = d2p->dict;
    mdef = d2p->mdef;
    lc = bin_mdef_silphone(mdef);
    for (i = 0; i < al->word.n_ent; ++i) {
        ps_alignment_entry_t *went = al->word.seq + i;
        ps_alignment_entry_t *sent;
        int wid = went->id.wid;
        int len = dict_pronlen(dict, wid);
        int j, rc;

        if (i < al->word.n_ent - 1)
            rc = dict_first_phone(dict, al->word.seq[i+1].id.wid);
        else
            rc = bin_mdef_silphone(mdef);

        /* First phone. */
        if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
            E_ERROR("Failed to add phone entry!\n");
            return -1;
        }
        sent->id.pid.cipid = dict_first_phone(dict, wid);
        sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
        sent->start = went->start;
        sent->duration = went->duration;
        sent->score = 0;
        sent->parent = i;
        went->child = (uint16)(sent - al->sseq.seq);
        if (len == 1)
            sent->id.pid.ssid
                = dict2pid_lrdiph_rc(d2p, sent->id.pid.cipid, lc, rc);
        else
            sent->id.pid.ssid
                = dict2pid_ldiph_lc(d2p, sent->id.pid.cipid,
                                    dict_second_phone(dict, wid), lc);
        assert(sent->id.pid.ssid != BAD_SSID);

        /* Internal phones. */
        for (j = 1; j < len - 1; ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_pron(dict, wid, j);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            sent->id.pid.ssid = dict2pid_internal(d2p, wid, j);
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }

        /* Last phone. */
        if (j < len) {
            xwdssid_t *rssid;
            assert(j == len - 1);
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_last_phone(dict, wid);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            rssid = dict2pid_rssid(d2p, sent->id.pid.cipid,
                                   dict_second_last_phone(dict, wid));
            sent->id.pid.ssid = rssid->ssid[rssid->cimap[rc]];
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }
        /* Update lc.  Could just use sent->id.pid.cipid here but that
         * seems needlessly obscure. */
        lc = dict_last_phone(dict, wid);
    }

    /* For each senone sequence, expand to senones.  (we could do this
     * nested above but this makes it more clear and easier to
     * refactor) */
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *sent;
        int j;

        for (j = 0; j < bin_mdef_n_emit_state(mdef); ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->state)) == NULL) {
                E_ERROR("Failed to add state entry!\n");
                return -1;
            }
            sent->id.senid = bin_mdef_sseq2sen(mdef, pent->id.pid.ssid, j);
            assert(sent->id.senid != BAD_SENID);
            sent->start = pent->start;
            sent->duration = pent->duration;
            sent->score = 0;
            sent->parent = i;
            if (j == 0)
                pent->child = (uint16)(sent - al->state.seq);
        }
    }

    return 0;
}